

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::OP_Memset
               (Var instance,int32 start,Var value,int32 length,ScriptContext *scriptContext)

{
  bool bVar1;
  Type TVar2;
  ThreadContext *pTVar3;
  long lVar4;
  code *pcVar5;
  uint6 uVar6;
  uint uVar7;
  bool bVar8;
  BOOL BVar9;
  undefined4 *puVar10;
  RecyclableObject *this;
  JavascriptArray *pJVar11;
  ulong uVar12;
  TypedArray<float,_false,_false> *this_00;
  TypedArray<unsigned_char,_true,_false> *this_01;
  TypedArray<double,_false,_false> *this_02;
  TypedArray<short,_false,_false> *this_03;
  TypedArray<unsigned_short,_false,_false> *this_04;
  TypedArray<char,_false,_false> *this_05;
  TypedArray<unsigned_char,_false,_false> *this_06;
  TypedArray<unsigned_int,_false,_false> *this_07;
  TypedArray<int,_false,_false> *this_08;
  undefined8 local_40;
  int32 intValue;
  uint32 local_34;
  
  pTVar3 = scriptContext->threadContext;
  bVar1 = pTVar3->noJsReentrancy;
  pTVar3->noJsReentrancy = true;
  intValue = 0;
  if (length < 1) goto LAB_0099f287;
  uVar12 = (ulong)(uint)start;
  local_34 = length;
  if (instance == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar8) goto LAB_0099f706;
    *puVar10 = 0;
  }
  bVar8 = TaggedInt::Is(instance);
  if ((ulong)instance >> 0x32 == 0 && !bVar8) {
    this = UnsafeVarTo<Js::RecyclableObject>(instance);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar8) goto LAB_0099f706;
      *puVar10 = 0;
    }
    TVar2 = ((this->type).ptr)->typeId;
    if ((0x57 < (int)TVar2) && (BVar9 = RecyclableObject::IsExternal(this), BVar9 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar8) goto LAB_0099f706;
      *puVar10 = 0;
    }
    uVar7 = local_40._4_4_;
    uVar6 = local_40._2_6_;
    switch(TVar2) {
    case TypeIds_Array:
    case TypeIds_NativeIntArray:
    case TypeIds_ArrayLast:
      if (start < 0) {
        for (; (start = (int32)uVar12, start < 0 && (0 < (int)local_34)); local_34 = local_34 - 1) {
          BVar9 = OP_SetElementI(instance,(Var)(uVar12 | 0x1000000000000),value,scriptContext,
                                 PropertyOperation_None);
          if (BVar9 == 0) {
            intValue = 0;
            goto LAB_0099f287;
          }
          uVar12 = (ulong)(start + 1);
        }
      }
      bVar8 = ScriptContextOptimizationOverrideInfo::IsEnabledArraySetElementFastPath
                        (&scriptContext->optimizationOverrides);
      if (bVar8) {
        lVar4 = *instance;
        if (TVar2 == TypeIds_NativeIntArray) {
          bVar8 = TaggedInt::Is(value);
          if (!bVar8) break;
          local_40 = (undefined1 *)((ulong)local_40._4_4_ << 0x20);
          bVar8 = MemsetConversion<int,_&Js::JavascriptConversion::ToInt32>
                            (value,scriptContext,(int *)&local_40);
          if (!bVar8 || (float)local_40 == -NAN) break;
          pJVar11 = UnsafeVarTo<Js::JavascriptArray>(instance);
          bVar8 = JavascriptArray::DirectSetItemAtRange<int>
                            (pJVar11,start,local_34,(int)(float)local_40);
        }
        else if (TVar2 == TypeIds_Array) {
          pJVar11 = UnsafeVarTo<Js::JavascriptArray>(instance);
          bVar8 = JavascriptArray::DirectSetItemAtRange<void*>(pJVar11,start,local_34,value);
        }
        else {
          if ((value < (Var)0x4000000000000) && (bVar8 = TaggedNumber::Is(value), !bVar8)) break;
          local_40 = (undefined1 *)0x0;
          bVar8 = MemsetConversion<double,_&Js::JavascriptConversion::ToNumber>
                            (value,scriptContext,(double *)&local_40);
          if (!bVar8 || local_40 == &DAT_fff80002fff80002) break;
          pJVar11 = UnsafeVarTo<Js::JavascriptArray>(instance);
          bVar8 = JavascriptArray::DirectSetItemAtRange<double>
                            (pJVar11,start,local_34,(double)local_40);
        }
        intValue = (int32)(byte)(lVar4 == *instance & bVar8);
      }
      break;
    default:
      goto switchD_0099f38b_caseD_1f;
    case TypeIds_Int8Array:
      local_40 = (undefined1 *)((ulong)local_40._1_7_ << 8);
      bVar8 = MemsetConversion<char,_&Js::JavascriptConversion::ToInt8>
                        (value,scriptContext,(char *)&local_40);
      if (bVar8) {
        this_05 = VarTo<Js::TypedArray<char,false,false>>(instance);
        intValue = TypedArray<char,_false,_false>::DirectSetItemAtRange
                             (this_05,start,local_34,(uchar)local_40);
      }
      break;
    case TypeIds_Uint8Array:
      local_40 = (undefined1 *)((ulong)local_40._1_7_ << 8);
      bVar8 = MemsetConversion<unsigned_char,_&Js::JavascriptConversion::ToUInt8>
                        (value,scriptContext,(uchar *)&local_40);
      if (bVar8) {
        this_06 = VarTo<Js::TypedArray<unsigned_char,false,false>>(instance);
        intValue = TypedArray<unsigned_char,_false,_false>::DirectSetItemAtRange
                             (this_06,start,local_34,(uchar)local_40);
      }
      break;
    case TypeIds_Uint8ClampedArray:
      local_40 = (undefined1 *)((ulong)local_40._1_7_ << 8);
      bVar8 = MemsetConversion<unsigned_char,_&Js::JavascriptConversion::ToUInt8Clamped>
                        (value,scriptContext,(uchar *)&local_40);
      if (bVar8) {
        this_01 = VarTo<Js::TypedArray<unsigned_char,true,false>>(instance);
        intValue = TypedArray<unsigned_char,_true,_false>::DirectSetItemAtRange
                             (this_01,start,local_34,(uchar)local_40);
      }
      break;
    case TypeIds_Int16Array:
      local_40 = (undefined1 *)((ulong)uVar6 << 0x10);
      bVar8 = MemsetConversion<short,_&Js::JavascriptConversion::ToInt16>
                        (value,scriptContext,(short *)&local_40);
      if (bVar8) {
        this_03 = VarTo<Js::TypedArray<short,false,false>>(instance);
        intValue = TypedArray<short,_false,_false>::DirectSetItemAtRange
                             (this_03,start,local_34,(unsigned_short)local_40);
      }
      break;
    case TypeIds_Uint16Array:
      local_40 = (undefined1 *)((ulong)uVar6 << 0x10);
      bVar8 = MemsetConversion<unsigned_short,_&Js::JavascriptConversion::ToUInt16>
                        (value,scriptContext,(unsigned_short *)&local_40);
      if (bVar8) {
        this_04 = VarTo<Js::TypedArray<unsigned_short,false,false>>(instance);
        intValue = TypedArray<unsigned_short,_false,_false>::DirectSetItemAtRange
                             (this_04,start,local_34,(unsigned_short)local_40);
      }
      break;
    case TypeIds_Int32Array:
      local_40 = (undefined1 *)((ulong)uVar7 << 0x20);
      bVar8 = MemsetConversion<int,_&Js::JavascriptConversion::ToInt32>
                        (value,scriptContext,(int *)&local_40);
      if (bVar8) {
        this_08 = VarTo<Js::TypedArray<int,false,false>>(instance);
        intValue = TypedArray<int,_false,_false>::DirectSetItemAtRange
                             (this_08,start,local_34,(int)(float)local_40);
      }
      break;
    case TypeIds_Uint32Array:
      local_40 = (undefined1 *)((ulong)uVar7 << 0x20);
      bVar8 = MemsetConversion<unsigned_int,_&Js::JavascriptConversion::ToUInt32>
                        (value,scriptContext,(uint *)&local_40);
      if (bVar8) {
        this_07 = VarTo<Js::TypedArray<unsigned_int,false,false>>(instance);
        intValue = TypedArray<unsigned_int,_false,_false>::DirectSetItemAtRange
                             (this_07,start,local_34,(uint)(float)local_40);
      }
      break;
    case TypeIds_Float32Array:
      local_40 = (undefined1 *)((ulong)uVar7 << 0x20);
      bVar8 = MemsetConversion<float,_&Js::JavascriptConversion::ToFloat>
                        (value,scriptContext,(float *)&local_40);
      if (bVar8) {
        this_00 = VarTo<Js::TypedArray<float,false,false>>(instance);
        intValue = TypedArray<float,_false,_false>::DirectSetItemAtRange
                             (this_00,start,local_34,(float)local_40);
      }
      break;
    case TypeIds_Float64Array:
      local_40 = (undefined1 *)0x0;
      bVar8 = MemsetConversion<double,_&Js::JavascriptConversion::ToNumber>
                        (value,scriptContext,(double *)&local_40);
      if (bVar8) {
        this_02 = VarTo<Js::TypedArray<double,false,false>>(instance);
        intValue = TypedArray<double,_false,_false>::DirectSetItemAtRange
                             (this_02,start,local_34,(double)local_40);
      }
    }
  }
  else {
switchD_0099f38b_caseD_1f:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x14aa,"(false)","We don\'t support this type for memset yet.");
    if (!bVar8) {
LAB_0099f706:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar10 = 0;
  }
LAB_0099f287:
  pTVar3->noJsReentrancy = bVar1;
  return intValue;
}

Assistant:

BOOL JavascriptOperators::OP_Memset(Var instance, int32 start, Var value, int32 length, ScriptContext* scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(Op_Memset, reentrancylock, scriptContext->GetThreadContext());
        if (length <= 0)
        {
            return false;
        }

        TypeId instanceType = JavascriptOperators::GetTypeId(instance);
        BOOL  returnValue = false;

        // The typed array will deal with all possible values for the index
#define MEMSET_TYPED_ARRAY_CASE(type, conversion) \
        case TypeIds_##type: \
        { \
            type## ::TypedArrayType typedValue = 0; \
            if (!MemsetConversion<type## ::TypedArrayType, JavascriptConversion:: ##conversion>(value, scriptContext, &typedValue)) return false; \
            returnValue = VarTo< type## >(instance)->DirectSetItemAtRange(start, length, typedValue); \
            break; \
        }
        switch (instanceType)
        {
        MEMSET_TYPED_ARRAY_CASE(Int8Array, ToInt8)
        MEMSET_TYPED_ARRAY_CASE(Uint8Array, ToUInt8)
        MEMSET_TYPED_ARRAY_CASE(Uint8ClampedArray, ToUInt8Clamped)
        MEMSET_TYPED_ARRAY_CASE(Int16Array, ToInt16)
        MEMSET_TYPED_ARRAY_CASE(Uint16Array, ToUInt16)
        MEMSET_TYPED_ARRAY_CASE(Int32Array, ToInt32)
        MEMSET_TYPED_ARRAY_CASE(Uint32Array, ToUInt32)
        MEMSET_TYPED_ARRAY_CASE(Float32Array, ToFloat)
        MEMSET_TYPED_ARRAY_CASE(Float64Array, ToNumber)
        case TypeIds_NativeFloatArray:
        case TypeIds_NativeIntArray:
        case TypeIds_Array:
        {
            if (start < 0)
            {
                for (start; start < 0 && length > 0; ++start, --length)
                {
                    if (!OP_SetElementI(instance, JavascriptNumber::ToVar(start, scriptContext), value, scriptContext))
                    {
                        return false;
                    }
                }
            }
            if (scriptContext->optimizationOverrides.IsEnabledArraySetElementFastPath())
            {
                INT_PTR vt = VirtualTableInfoBase::GetVirtualTable(instance);
                if (instanceType == TypeIds_Array)
                {
                    returnValue = UnsafeVarTo<JavascriptArray>(instance)->DirectSetItemAtRange<Var>(start, length, value);
                }
                else if (instanceType == TypeIds_NativeIntArray)
                {
                    // Only accept tagged int.
                    if (!TaggedInt::Is(value))
                    {
                        return false;
                    }
                    int32 intValue = 0;
                    if (!MemsetConversion<int32, JavascriptConversion::ToInt32>(value, scriptContext, &intValue))
                    {
                        return false;
                    }
                     // Special case for missing item
                    if (SparseArraySegment<int32>::IsMissingItem(&intValue))
                    {
                        return false;
                    }
                    returnValue = UnsafeVarTo<JavascriptArray>(instance)->DirectSetItemAtRange<int32>(start, length, intValue);
                }
                else
                {
                    // For native float arrays, the jit doesn't check the type of the source so we have to do it here
                    if (!JavascriptNumber::Is(value) && !TaggedNumber::Is(value))
                    {
                        return false;
                    }

                    double doubleValue = 0;
                    if (!MemsetConversion<double, JavascriptConversion::ToNumber>(value, scriptContext, &doubleValue))
                    {
                        return false;
                    }
                    // Special case for missing item
                    if (SparseArraySegment<double>::IsMissingItem(&doubleValue))
                    {
                        return false;
                    }
                    returnValue = UnsafeVarTo<JavascriptArray>(instance)->DirectSetItemAtRange<double>(start, length, doubleValue);
                }
                returnValue &= vt == VirtualTableInfoBase::GetVirtualTable(instance);
            }
            break;
        }
        default:
            AssertMsg(false, "We don't support this type for memset yet.");
            break;
        }

#undef MEMSET_TYPED_ARRAY
        return returnValue;
        JIT_HELPER_END(Op_Memset);
    }